

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O3

SRes LzmaDecode(Byte *dest,SizeT *destLen,Byte *src,SizeT *srcLen,Byte *propData,uint propSize,
               ELzmaFinishMode finishMode,ELzmaStatus *status,ISzAlloc *alloc)

{
  SizeT dicLimit;
  ulong uVar1;
  SRes SVar2;
  CLzmaDec CStack_b8;
  
  dicLimit = *destLen;
  uVar1 = *srcLen;
  *srcLen = 0;
  *destLen = 0;
  *status = LZMA_STATUS_NOT_SPECIFIED;
  SVar2 = 6;
  if (4 < uVar1) {
    CStack_b8.probs = (UInt16 *)0x0;
    CStack_b8.dic = (Byte *)0x0;
    SVar2 = LzmaDec_AllocateProbs(&CStack_b8,propData,propSize,alloc);
    if (SVar2 == 0) {
      CStack_b8.dicPos = 0;
      CStack_b8.remainLen = 0;
      CStack_b8.needFlush = 1;
      CStack_b8.tempBufSize = 0;
      CStack_b8.processedPos = 0;
      CStack_b8.checkDicSize = 0;
      CStack_b8.needInitState = 1;
      *srcLen = uVar1;
      CStack_b8.dic = dest;
      CStack_b8.dicBufSize = dicLimit;
      SVar2 = LzmaDec_DecodeToDic(&CStack_b8,dicLimit,src,srcLen,finishMode,status);
      *destLen = CStack_b8.dicPos;
      if ((SVar2 == 0) && (SVar2 = 0, *status == LZMA_STATUS_NEEDS_MORE_INPUT)) {
        SVar2 = 6;
      }
      (*alloc->Free)(alloc,CStack_b8.probs);
    }
  }
  return SVar2;
}

Assistant:

SRes LzmaDecode(Byte *dest, SizeT *destLen, const Byte *src, SizeT *srcLen,
    const Byte *propData, unsigned propSize, ELzmaFinishMode finishMode,
    ELzmaStatus *status, ISzAlloc *alloc)
{
  CLzmaDec p;
  SRes res;
  SizeT outSize = *destLen, inSize = *srcLen;
  *destLen = *srcLen = 0;
  *status = LZMA_STATUS_NOT_SPECIFIED;
  if (inSize < RC_INIT_SIZE)
    return SZ_ERROR_INPUT_EOF;
  LzmaDec_Construct(&p);
  RINOK(LzmaDec_AllocateProbs(&p, propData, propSize, alloc));
  p.dic = dest;
  p.dicBufSize = outSize;
  LzmaDec_Init(&p);
  *srcLen = inSize;
  res = LzmaDec_DecodeToDic(&p, outSize, src, srcLen, finishMode, status);
  *destLen = p.dicPos;
  if (res == SZ_OK && *status == LZMA_STATUS_NEEDS_MORE_INPUT)
    res = SZ_ERROR_INPUT_EOF;
  LzmaDec_FreeProbs(&p, alloc);
  return res;
}